

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileParser::getTwoVectors3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_a,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_b)

{
  char *pBuffer;
  pointer *ppaVar1;
  iterator iVar2;
  byte *pbVar3;
  byte *pbVar4;
  float fVar5;
  float fVar6;
  byte *pbVar7;
  ai_real ret;
  aiVector3t<float> local_3c;
  
  pBuffer = this->m_buffer;
  copyNextWord(this,pBuffer,0x1000);
  local_3c.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_3c.x,true);
  fVar5 = local_3c.x;
  copyNextWord(this,pBuffer,0x1000);
  local_3c.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_3c.x,true);
  fVar6 = local_3c.x;
  copyNextWord(this,pBuffer,0x1000);
  local_3c.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_3c.x,true);
  local_3c.y = fVar6;
  local_3c.z = local_3c.x;
  iVar2._M_current =
       (point3d_array_a->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (point3d_array_a->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_3c.x = fVar5;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array_a,iVar2,
               &local_3c);
  }
  else {
    (iVar2._M_current)->z = local_3c.x;
    (iVar2._M_current)->x = fVar5;
    (iVar2._M_current)->y = fVar6;
    ppaVar1 = &(point3d_array_a->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
    local_3c.x = fVar5;
  }
  copyNextWord(this,pBuffer,0x1000);
  local_3c.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_3c.x,true);
  fVar5 = local_3c.x;
  copyNextWord(this,pBuffer,0x1000);
  local_3c.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_3c.x,true);
  fVar6 = local_3c.x;
  copyNextWord(this,pBuffer,0x1000);
  local_3c.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_3c.x,true);
  local_3c.y = fVar6;
  local_3c.z = local_3c.x;
  iVar2._M_current =
       (point3d_array_b->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (point3d_array_b->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_3c.x = fVar5;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array_b,iVar2,
               &local_3c);
  }
  else {
    (iVar2._M_current)->z = local_3c.x;
    (iVar2._M_current)->x = fVar5;
    (iVar2._M_current)->y = fVar6;
    ppaVar1 = &(point3d_array_b->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  pbVar7 = (byte *)(this->m_DataIt)._M_current;
  pbVar3 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar3 + -1 != pbVar7 && pbVar7 != pbVar3) {
    do {
      if (((*pbVar7 < 0xe) && ((0x3401U >> (*pbVar7 & 0x1f) & 1) != 0)) ||
         (pbVar7 = pbVar7 + 1, pbVar7 == pbVar3)) break;
    } while (pbVar7 != pbVar3 + -1);
  }
  pbVar4 = pbVar7;
  if (pbVar7 != pbVar3) {
    pbVar7 = pbVar7 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar4 = pbVar7;
  }
  for (; (pbVar4 != pbVar3 && ((*pbVar4 == 0x20 || (pbVar7 = pbVar4, *pbVar4 == 9))));
      pbVar4 = pbVar4 + 1) {
    pbVar7 = pbVar3;
  }
  (this->m_DataIt)._M_current = (char *)pbVar7;
  return;
}

Assistant:

void ObjFileParser::getTwoVectors3( std::vector<aiVector3D> &point3d_array_a, std::vector<aiVector3D> &point3d_array_b ) {
    ai_real x, y, z;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array_a.push_back( aiVector3D( x, y, z ) );

    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array_b.push_back( aiVector3D( x, y, z ) );

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}